

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileHelper.h
# Opt level: O0

void __thiscall Assimp::XFile::Node::~Node(Node *this)

{
  Node *this_00;
  Mesh *this_01;
  size_type sVar1;
  reference ppNVar2;
  reference ppMVar3;
  uint local_18;
  uint local_14;
  uint a_1;
  uint a;
  Node *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>::size
                      (&this->mChildren);
    if (sVar1 <= local_14) break;
    ppNVar2 = std::vector<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>::operator[]
                        (&this->mChildren,(ulong)local_14);
    this_00 = *ppNVar2;
    if (this_00 != (Node *)0x0) {
      ~Node(this_00);
      operator_delete(this_00,0x98);
    }
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>::size
                      (&this->mMeshes);
    if (sVar1 <= local_18) break;
    ppMVar3 = std::vector<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>::operator[]
                        (&this->mMeshes,(ulong)local_18);
    this_01 = *ppMVar3;
    if (this_01 != (Mesh *)0x0) {
      XFile::Mesh::~Mesh(this_01);
      operator_delete(this_01,600);
    }
    local_18 = local_18 + 1;
  }
  std::vector<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>::~vector
            (&this->mMeshes);
  std::vector<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>::~vector
            (&this->mChildren);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Node() {
        for (unsigned int a = 0; a < mChildren.size(); ++a ) {
            delete mChildren[a];
        }
        for (unsigned int a = 0; a < mMeshes.size(); ++a) {
            delete mMeshes[a];
        }
    }